

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O2

void __thiscall duckdb::CSVReaderOptions::SetDelimiter(CSVReaderOptions *this,string *input)

{
  InvalidInputException *this_00;
  allocator local_c2;
  allocator local_c1;
  string local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string delim_str;
  string local_40;
  
  ::std::__cxx11::string::string((string *)&local_40,(string *)input);
  ::std::__cxx11::string::string((string *)&local_c0,"\\t",&local_c1);
  ::std::__cxx11::string::string((string *)&local_a0,anon_var_dwarf_4bad2e4 + 7,&local_c2);
  StringUtil::Replace(&delim_str,&local_40,&local_c0,&local_a0);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::__cxx11::string::~string((string *)&local_40);
  if (delim_str._M_string_length < 5) {
    ::std::__cxx11::string::string((string *)&local_80,(string *)&delim_str);
    CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
              ((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this,&local_80,true);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&delim_str);
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_c0,"The delimiter option cannot exceed a size of 4 bytes.",
             (allocator *)&local_a0);
  InvalidInputException::InvalidInputException(this_00,&local_c0);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVReaderOptions::SetDelimiter(const string &input) {
	auto delim_str = StringUtil::Replace(input, "\\t", "\t");
	if (delim_str.size() > 4) {
		throw InvalidInputException("The delimiter option cannot exceed a size of 4 bytes.");
	}
	this->dialect_options.state_machine_options.delimiter.Set(delim_str);
}